

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minireflect.h
# Opt level: O2

void __thiscall
flatbuffers::ToStringVisitor::ToStringVisitor
          (ToStringVisitor *this,string *delimiter,bool quotes,string *indent,bool vdelimited)

{
  (this->super_IterationVisitor)._vptr_IterationVisitor = (_func_int **)&PTR_StartSequence_001f1010;
  (this->s)._M_dataplus._M_p = (pointer)&(this->s).field_2;
  (this->s)._M_string_length = 0;
  (this->s).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&this->d,(string *)delimiter);
  this->q = quotes;
  std::__cxx11::string::string((string *)&this->in,(string *)indent);
  this->indent_level = 0;
  this->vector_delimited = vdelimited;
  return;
}

Assistant:

ToStringVisitor(std::string delimiter, bool quotes, std::string indent,
                  bool vdelimited = true)
      : d(delimiter),
        q(quotes),
        in(indent),
        indent_level(0),
        vector_delimited(vdelimited) {}